

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

string * __thiscall
fmt::v11::vformat_abi_cxx11_
          (string *__return_storage_ptr__,v11 *this,string_view fmt,format_args args)

{
  string_view fmt_00;
  format_args args_00;
  memory_buffer buffer;
  buffer<char> local_228;
  char local_208 [504];
  
  args_00.field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)args.desc_;
  args_00.desc_ = fmt.size_;
  fmt_00.size_ = fmt.data_;
  local_228.size_ = 0;
  local_228.grow_ = basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_228.capacity_ = 500;
  fmt_00.data_ = (char *)this;
  local_228.ptr_ = local_208;
  detail::vformat_to(&local_228,fmt_00,args_00,(locale_ref)0x0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_228.ptr_,local_228.ptr_ + local_228.size_);
  if (local_228.ptr_ != local_208) {
    free(local_228.ptr_);
  }
  return __return_storage_ptr__;
}

Assistant:

FMT_FUNC auto vformat(string_view fmt, format_args args) -> std::string {
  // Don't optimize the "{}" case to keep the binary size small and because it
  // can be better optimized in fmt::format anyway.
  auto buffer = memory_buffer();
  detail::vformat_to(buffer, fmt, args);
  return to_string(buffer);
}